

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenX_Commands.cpp
# Opt level: O0

void __thiscall
KickBanIRCCommand::trigger
          (KickBanIRCCommand *this,IRC_Bot *source,string_view channel,string_view nick,
          string_view parameters)

{
  Server *pSVar1;
  string_view name_00;
  vector<RenX::Server_*,_std::allocator<RenX::Server_*>_> *this_00;
  Channel *pCVar2;
  KickBanIRCCommand *pKVar3;
  size_t sVar4;
  char *pcVar5;
  bool bVar6;
  size_type sVar7;
  long lVar8;
  basic_string_view<char,_std::char_traits<char>_> *pbVar9;
  basic_string_view<char,_std::char_traits<char>_> *in_whitespace;
  basic_string_view<char,_std::char_traits<char>_> bVar10;
  size_t local_268;
  char *local_260;
  size_t local_248;
  char *local_240;
  string local_228;
  __sv_type local_208;
  undefined4 local_1f8;
  undefined4 uStack_1f4;
  undefined4 uStack_1f0;
  undefined4 uStack_1ec;
  char *local_1e8;
  size_t sStack_1e0;
  string local_1d8;
  __sv_type local_1b8;
  char *local_1a8;
  basic_string_view<char,_std::char_traits<char>_> *pbStack_1a0;
  rep local_190;
  char *local_188;
  size_t sStack_180;
  __sv_type local_178;
  undefined4 local_168;
  undefined4 uStack_164;
  undefined4 uStack_160;
  undefined4 uStack_15c;
  reference local_150;
  Server **server;
  const_iterator __end4;
  const_iterator __begin4;
  vector<RenX::Server_*,_std::allocator<RenX::Server_*>_> *__range4;
  undefined1 local_128 [8];
  string banner;
  char *local_100;
  undefined1 auStack_f8 [8];
  string_view reason;
  string_view name;
  basic_string_view<char,_std::char_traits<char>_> local_c8;
  size_t local_b8;
  char *pcStack_b0;
  undefined1 local_a0 [8];
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
  command_split;
  uint kicks;
  PlayerInfo *player;
  vector<RenX::Server_*,_std::allocator<RenX::Server_*>_> *local_58;
  vector<RenX::Server_*,_std::allocator<RenX::Server_*>_> *servers;
  basic_string_view<char,_std::char_traits<char>_> *local_48;
  long local_40;
  Channel *chan;
  IRC_Bot *source_local;
  KickBanIRCCommand *this_local;
  string_view nick_local;
  string_view channel_local;
  
  nick_local._M_len = (size_t)nick._M_str;
  this_local = (KickBanIRCCommand *)nick._M_len;
  pbVar9 = (basic_string_view<char,_std::char_traits<char>_> *)channel._M_str;
  nick_local._M_str = (char *)channel._M_len;
  in_whitespace = pbVar9;
  chan = (Channel *)source;
  source_local = (IRC_Bot *)this;
  bVar6 = std::basic_string_view<char,_std::char_traits<char>_>::empty(&parameters);
  sVar4 = nick_local._M_len;
  pKVar3 = this_local;
  pCVar2 = chan;
  if (bVar6) {
    bVar10 = sv("Error: Too Few Parameters. Syntax: KickBan <Player> [Reason]",0x3c);
    local_268 = bVar10._M_len;
    local_260 = bVar10._M_str;
    Jupiter::IRC::Client::sendNotice(pCVar2,pKVar3,sVar4,local_268,local_260);
  }
  else {
    servers = (vector<RenX::Server_*,_std::allocator<RenX::Server_*>_> *)nick_local._M_str;
    local_48 = pbVar9;
    local_40 = Jupiter::IRC::Client::getChannel(chan,nick_local._M_str,pbVar9);
    if (local_40 != 0) {
      RenX::getCore();
      Jupiter::IRC::Client::Channel::getType();
      RenX::Core::getServers((int)&player);
      local_58 = (vector<RenX::Server_*,_std::allocator<RenX::Server_*>_> *)&player;
      sVar7 = std::vector<RenX::Server_*,_std::allocator<RenX::Server_*>_>::size(local_58);
      pcVar5 = nick_local._M_str;
      pCVar2 = chan;
      if (sVar7 == 0) {
        bVar10 = sv("Error: Channel not attached to any connected Renegade X servers.",0x40);
        local_248 = bVar10._M_len;
        local_240 = bVar10._M_str;
        Jupiter::IRC::Client::sendMessage(pCVar2,pcVar5,pbVar9,local_248,local_240);
      }
      else {
        command_split.second._M_str._4_4_ = 0;
        local_b8 = parameters._M_len;
        pcStack_b0 = parameters._M_str;
        std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_c8," \t");
        jessilib::
        word_split_once_view<,std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>>
                  ((pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
                    *)local_a0,(jessilib *)&local_b8,&local_c8,in_whitespace);
        reason._M_str = (char *)local_a0;
        auStack_f8 = (undefined1  [8])command_split.first._M_str;
        reason._M_len = command_split.second._M_len;
        bVar6 = std::basic_string_view<char,_std::char_traits<char>_>::empty
                          ((basic_string_view<char,_std::char_traits<char>_> *)auStack_f8);
        if (bVar6) {
          join_0x00000010_0x00000000_ = sv("No reason",9);
          auStack_f8 = (undefined1  [8])banner.field_2._8_8_;
          reason._M_len = (size_t)local_100;
        }
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
                  ((string *)local_128,
                   (basic_string_view<char,_std::char_traits<char>_> *)&this_local,
                   (allocator<char> *)((long)&__range4 + 7));
        std::allocator<char>::~allocator((allocator<char> *)((long)&__range4 + 7));
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator+=
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_128,
                   "@IRC");
        this_00 = local_58;
        __end4 = std::vector<RenX::Server_*,_std::allocator<RenX::Server_*>_>::begin(local_58);
        server = (Server **)
                 std::vector<RenX::Server_*,_std::allocator<RenX::Server_*>_>::end(this_00);
        while (bVar6 = __gnu_cxx::
                       operator==<RenX::Server_*const_*,_std::vector<RenX::Server_*,_std::allocator<RenX::Server_*>_>_>
                                 (&__end4,(__normal_iterator<RenX::Server_*const_*,_std::vector<RenX::Server_*,_std::allocator<RenX::Server_*>_>_>
                                           *)&server), pCVar2 = chan, ((bVar6 ^ 0xffU) & 1) != 0) {
          local_150 = __gnu_cxx::
                      __normal_iterator<RenX::Server_*const_*,_std::vector<RenX::Server_*,_std::allocator<RenX::Server_*>_>_>
                      ::operator*(&__end4);
          if (*local_150 != (Server *)0x0) {
            name._M_len._0_4_ = (undefined4)command_split.first._M_len;
            name._M_len._4_4_ = (undefined4)(command_split.first._M_len >> 0x20);
            local_168 = reason._M_str._0_4_;
            uStack_164 = reason._M_str._4_4_;
            uStack_160 = (undefined4)name._M_len;
            uStack_15c = name._M_len._4_4_;
            lVar8 = RenX::Server::getPlayerByPartName
                              (*local_150,reason._M_str,command_split.first._M_len);
            if (lVar8 != 0) {
              pSVar1 = *local_150;
              local_178 = std::__cxx11::string::operator_cast_to_basic_string_view
                                    ((string *)local_128);
              local_188 = (char *)auStack_f8;
              sStack_180 = reason._M_len;
              local_190 = (rep)std::chrono::duration<long,_std::ratio<1L,_1L>_>::zero();
              RenX::Server::banPlayer
                        (pSVar1,lVar8,local_178._M_len,local_178._M_str,local_188,sStack_180,
                         local_190);
              command_split.second._M_str._4_4_ = command_split.second._M_str._4_4_ + 1;
            }
          }
          __gnu_cxx::
          __normal_iterator<RenX::Server_*const_*,_std::vector<RenX::Server_*,_std::allocator<RenX::Server_*>_>_>
          ::operator++(&__end4);
        }
        if (command_split.second._M_str._4_4_ == 0) {
          local_1a8 = nick_local._M_str;
          local_1e8 = reason._M_str;
          sStack_1e0 = command_split.first._M_len;
          name_00._M_str = (char *)command_split.first._M_len;
          name_00._M_len = (size_t)reason._M_str;
          pbStack_1a0 = pbVar9;
          player_not_found_message_abi_cxx11_(&local_1d8,name_00);
          local_1b8 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)&local_1d8)
          ;
          Jupiter::IRC::Client::sendMessage
                    (pCVar2,local_1a8,pbStack_1a0,local_1b8._M_len,local_1b8._M_str);
          std::__cxx11::string::~string((string *)&local_1d8);
        }
        else {
          channel_local._M_len._0_4_ = channel._M_str._0_4_;
          channel_local._M_len._4_4_ = channel._M_str._4_4_;
          local_1f8 = nick_local._M_str._0_4_;
          uStack_1f4 = nick_local._M_str._4_4_;
          uStack_1f0 = (undefined4)channel_local._M_len;
          uStack_1ec = channel_local._M_len._4_4_;
          string_printf_abi_cxx11_
                    (&local_228,"%u players kicked.",(ulong)command_split.second._M_str._4_4_);
          local_208 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)&local_228)
          ;
          Jupiter::IRC::Client::sendMessage
                    (pCVar2,CONCAT44(uStack_1f4,local_1f8),CONCAT44(uStack_1ec,uStack_1f0),
                     local_208._M_len,local_208._M_str);
          std::__cxx11::string::~string((string *)&local_228);
          RenX::getCore();
          RenX::Core::banCheck();
        }
        std::__cxx11::string::~string((string *)local_128);
      }
      std::vector<RenX::Server_*,_std::allocator<RenX::Server_*>_>::~vector
                ((vector<RenX::Server_*,_std::allocator<RenX::Server_*>_> *)&player);
    }
  }
  return;
}

Assistant:

void KickBanIRCCommand::trigger(IRC_Bot *source, std::string_view channel, std::string_view nick, std::string_view parameters) {
	if (!parameters.empty()) {
		Jupiter::IRC::Client::Channel *chan = source->getChannel(channel);
		if (chan != nullptr) {
			const auto& servers = RenX::getCore()->getServers(chan->getType());
			if (servers.size() != 0)
			{
				RenX::PlayerInfo *player;
				unsigned int kicks = 0;
				auto command_split = jessilib::word_split_once_view(std::string_view{parameters}, WHITESPACE_SV);
				std::string_view name = command_split.first;
				std::string_view reason = command_split.second;
				if (reason.empty()) {
					reason = "No reason"sv;
				}

				std::string banner{ nick };
				banner += "@IRC";
				for (const auto& server : servers) {
					if (server != nullptr) {
						player = server->getPlayerByPartName(name);
						if (player != nullptr) {
							server->banPlayer(*player, banner, reason);
							kicks++;
						}
					}
				}
				if (kicks == 0) {
					source->sendMessage(channel, player_not_found_message(name));
				}
				else {
					source->sendMessage(channel, string_printf("%u players kicked.", kicks));
					RenX::getCore()->banCheck();
				}
			}
			else source->sendMessage(channel, "Error: Channel not attached to any connected Renegade X servers."sv);
		}
	}
	else source->sendNotice(nick, "Error: Too Few Parameters. Syntax: KickBan <Player> [Reason]"sv);
}